

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O0

DASHEventMessageBoxv1 *
generate_event_message_vtt_time
          (DASHEventMessageBoxv1 *__return_storage_ptr__,uint32_t id,uint64_t presentation_time,
          uint64_t duration,uint32_t timescale,uint32_t off)

{
  tm *__tp;
  value_type_conflict local_17d;
  int local_17c;
  long lStack_178;
  int k;
  time_t epochTime;
  char *format;
  char timestamp [64];
  DASHEventMessageBoxv1 local_118;
  undefined1 local_31;
  uint32_t local_30;
  uint32_t local_2c;
  uint32_t off_local;
  uint32_t timescale_local;
  uint64_t duration_local;
  uint64_t presentation_time_local;
  DASHEventMessageBoxv1 *pDStack_10;
  uint32_t id_local;
  DASHEventMessageBoxv1 *ev;
  
  local_31 = 0;
  local_30 = off;
  local_2c = timescale;
  _off_local = duration;
  duration_local = presentation_time;
  presentation_time_local._4_4_ = id;
  pDStack_10 = __return_storage_ptr__;
  event_track::DASHEventMessageBoxv1::DASHEventMessageBoxv1(__return_storage_ptr__);
  local_118.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.value_.field_2._M_allocated_capacity = 0;
  local_118.value_.field_2._8_8_ = 0;
  local_118.value_._M_dataplus = (_Alloc_hider)0x0;
  local_118.value_._1_7_ = 0;
  local_118.value_._M_string_length = 0;
  local_118.scheme_id_uri_.field_2._M_allocated_capacity = 0;
  local_118.scheme_id_uri_.field_2._8_8_ = 0;
  local_118.scheme_id_uri_._M_dataplus = (_Alloc_hider)0x0;
  local_118.scheme_id_uri_._1_7_ = 0;
  local_118.scheme_id_uri_._M_string_length = 0;
  local_118.presentation_time_ = 0;
  local_118.event_duration_ = 0;
  local_118.id_ = 0;
  local_118.super_full_box.super_box.is_large_ = false;
  local_118.super_full_box.super_box.has_uuid_ = false;
  local_118.super_full_box.super_box._98_6_ = 0;
  local_118.super_full_box.magic_conf_ = 0;
  local_118.super_full_box._108_4_ = 0;
  local_118.super_full_box.super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_118.super_full_box.super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_118.super_full_box.super_box.extended_type_[8] = '\0';
  local_118.super_full_box.super_box.extended_type_[9] = '\0';
  local_118.super_full_box.super_box.extended_type_[10] = '\0';
  local_118.super_full_box.super_box.extended_type_[0xb] = '\0';
  local_118.super_full_box.super_box.extended_type_[0xc] = '\0';
  local_118.super_full_box.super_box.extended_type_[0xd] = '\0';
  local_118.super_full_box.super_box.extended_type_[0xe] = '\0';
  local_118.super_full_box.super_box.extended_type_[0xf] = '\0';
  local_118.super_full_box.super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_118.super_full_box.super_box.box_type_.field_2._8_8_ = 0;
  local_118.super_full_box.super_box.extended_type_[0] = '\0';
  local_118.super_full_box.super_box.extended_type_[1] = '\0';
  local_118.super_full_box.super_box.extended_type_[2] = '\0';
  local_118.super_full_box.super_box.extended_type_[3] = '\0';
  local_118.super_full_box.super_box.extended_type_[4] = '\0';
  local_118.super_full_box.super_box.extended_type_[5] = '\0';
  local_118.super_full_box.super_box.extended_type_[6] = '\0';
  local_118.super_full_box.super_box.extended_type_[7] = '\0';
  local_118.super_full_box.super_box.box_type_._M_string_length = 0;
  local_118.super_full_box.super_box.box_type_.field_2._M_allocated_capacity = 0;
  local_118.super_full_box.super_box.large_size_ = 0;
  local_118.super_full_box.super_box.box_type_._M_dataplus = (_Alloc_hider)0x0;
  local_118.super_full_box.super_box.box_type_._1_7_ = 0;
  local_118.super_full_box.super_box._vptr_box = (_func_int **)0x0;
  local_118.super_full_box.super_box.size_ = 0;
  local_118.super_full_box.super_box._12_4_ = 0;
  local_118.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  event_track::DASHEventMessageBoxv1::DASHEventMessageBoxv1(&local_118);
  event_track::DASHEventMessageBoxv1::operator=(__return_storage_ptr__,&local_118);
  event_track::DASHEventMessageBoxv1::~DASHEventMessageBoxv1(&local_118);
  __return_storage_ptr__->id_ = presentation_time_local._4_4_;
  __return_storage_ptr__->presentation_time_ = duration_local;
  __return_storage_ptr__->event_duration_ = off_local;
  *(uint32_t *)&(__return_storage_ptr__->super_full_box).field_0x6c = local_2c;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->scheme_id_uri_,"urn:webvtt");
  memset(&format,0,0x40);
  epochTime = (time_t)anon_var_dwarf_4f7d;
  lStack_178 = (long)duration_local / (long)(ulong)local_2c;
  __tp = gmtime(&stack0xfffffffffffffe88);
  strftime((char *)&format,0x40,"%Y-%m-%d %H:%M:%S",__tp);
  for (local_17c = 0; local_17c < 0x40; local_17c = local_17c + 1) {
    if (timestamp[(long)local_17c + -8] != '\0') {
      local_17d = timestamp[(long)local_17c + -8];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&__return_storage_ptr__->message_data_,&local_17d);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

event_track::DASHEventMessageBoxv1 generate_event_message_vtt_time(
    uint32_t id,
    uint64_t presentation_time,
    uint64_t duration,
    uint32_t timescale,
    uint32_t off)
{

    event_track::DASHEventMessageBoxv1 ev;
    ev = {};
    ev.id_ = id;
    ev.presentation_time_ = presentation_time;
    ev.event_duration_ = (uint32_t)duration;
    ev.timescale_ = timescale;
    ev.scheme_id_uri_ = "urn:webvtt";

    //static std::string getTimeStamp(time_t epochTime, const char* format = "%Y-%m-%d %H:%M:%S")
    //{
    char timestamp[64] = { 0 };
    const char* format = "%Y-%m-%d %H:%M:%S";
    std::time_t epochTime = (time_t) presentation_time / timescale;
    std::strftime(timestamp, sizeof(timestamp), format, gmtime(&epochTime));
    
    for (int k = 0; k < 64; k++)
        if(timestamp[k] != '\0')
           ev.message_data_.push_back(timestamp[k]);

    return ev;
}